

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  int iVar1;
  ImVector<ImGuiTabItem> *in_RDI;
  int move_count;
  ImGuiTabItem *dst_tab;
  ImGuiTabItem *src_tab;
  ImGuiTabItem item_tmp;
  ImGuiTabItem *tab2;
  int tab2_order;
  ImGuiTabItem *tab1;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  ImGuiTabBar *in_stack_ffffffffffffff80;
  ImGuiTabItem *__dest;
  ImGuiTabItem *local_78;
  undefined1 local_54 [44];
  ImGuiTabItem *local_28;
  int local_1c;
  ImGuiTabItem *local_18;
  ImVector<ImGuiTabItem> *local_10;
  bool local_1;
  
  local_10 = in_RDI;
  local_18 = TabBarFindTabByID((ImGuiTabBar *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
  if ((local_18 == (ImGuiTabItem *)0x0) || ((local_18->Flags & 0x20U) != 0)) {
    local_1 = false;
  }
  else {
    local_1c = ImGuiTabBar::GetTabOrder
                         (in_stack_ffffffffffffff80,
                          (ImGuiTabItem *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_1c = local_1c + *(short *)&local_10[6].Data;
    if ((local_1c < 0) || (local_10->Size <= local_1c)) {
      local_1 = false;
    }
    else {
      local_28 = ImVector<ImGuiTabItem>::operator[](local_10,local_1c);
      if ((local_28->Flags & 0x20U) == 0) {
        if ((local_18->Flags & 0xc0U) == (local_28->Flags & 0xc0U)) {
          memcpy(local_54,local_18,0x2c);
          if (*(short *)&local_10[6].Data < 1) {
            local_78 = local_28;
          }
          else {
            local_78 = local_18 + 1;
          }
          __dest = local_18;
          if (*(short *)&local_10[6].Data < 1) {
            __dest = local_28 + 1;
          }
          if (*(short *)&local_10[6].Data < 1) {
            iVar1 = -(int)*(short *)&local_10[6].Data;
          }
          else {
            iVar1 = (int)*(short *)&local_10[6].Data;
          }
          memmove(__dest,local_78,(long)iVar1 * 0x2c);
          memcpy(local_28,local_54,0x29);
          if ((local_10[1].Size & 0x400000U) != 0) {
            MarkIniSettingsDirty();
          }
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestOffset;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered tabs must share the same section
    // (Note: TabBarQueueReorderFromMousePos() also has a similar test but since we allow direct calls to TabBarQueueReorder() we do it here too)
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & ImGuiTabItemFlags_SectionMask_) != (tab2->Flags & ImGuiTabItemFlags_SectionMask_))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    ImGuiTabItem* src_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 + 1 : tab2;
    ImGuiTabItem* dst_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 : tab2 + 1;
    const int move_count = (tab_bar->ReorderRequestOffset > 0) ? tab_bar->ReorderRequestOffset : -tab_bar->ReorderRequestOffset;
    memmove(dst_tab, src_tab, move_count * sizeof(ImGuiTabItem));
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}